

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector3T.h
# Opt level: O2

bool compare(Vector3 *a,Vector3 *b,string *str,double epsilon)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = a->m_x - b->m_x;
  dVar2 = a->m_y - b->m_y;
  dVar3 = a->m_z - b->m_z;
  dVar2 = SQRT(dVar3 * dVar3 + dVar4 * dVar4 + dVar2 * dVar2);
  if (epsilon <= dVar2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error in ");
    poVar1 = std::operator<<(poVar1,(string *)str);
    poVar1 = std::operator<<(poVar1,":");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = CD_Matrix::operator<<((ostream *)&std::cerr,a);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = CD_Matrix::operator<<(poVar1,b);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return dVar2 < epsilon;
}

Assistant:

inline Vector3T operator-(const struct Vector3T<T, b> & v) const
  {
    Vector3T vr;
    vr.m_x = m_x - v.m_x;
    vr.m_y = m_y - v.m_y;
    vr.m_z = m_z - v.m_z;
    return vr;
  }